

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall rw::Image::extractMask(Image *this)

{
  uint8 uVar1;
  int32 i;
  Image *this_00;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  int32 y;
  int iVar5;
  byte bVar6;
  int32 x;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  this_00 = create(this->width,this->height,8);
  allocate(this_00);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar1 = (uint8)lVar2;
    this_00->palette[lVar2 * 4] = uVar1;
    this_00->palette[lVar2 * 4 + 1] = uVar1;
    this_00->palette[lVar2 * 4 + 2] = uVar1;
    this_00->palette[lVar2 * 4 + 3] = 0xff;
  }
  pbVar3 = this->pixels;
  pbVar4 = this_00->pixels;
  iVar5 = 0;
  do {
    if (this->height <= iVar5) {
      return this_00;
    }
    pbVar8 = pbVar4;
    pbVar9 = pbVar3;
    for (iVar7 = 0; iVar7 < this->width; iVar7 = iVar7 + 1) {
      switch(this->depth << 0x1e | this->depth - 4U >> 2) {
      case 0:
      case 1:
        bVar6 = this->palette[(ulong)*pbVar9 * 4 + 3];
        lVar2 = 1;
        break;
      default:
        goto switchD_0010afa5_caseD_2;
      case 3:
        bVar6 = (char)pbVar9[1] >> 7;
        lVar2 = 2;
        break;
      case 5:
        bVar6 = 0xff;
        lVar2 = 3;
        break;
      case 7:
        bVar6 = pbVar9[3];
        lVar2 = 4;
      }
      *pbVar8 = bVar6;
      pbVar8 = pbVar8 + 1;
      pbVar9 = pbVar9 + lVar2;
switchD_0010afa5_caseD_2:
    }
    pbVar3 = pbVar3 + this->stride;
    pbVar4 = pbVar4 + this_00->stride;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Image*
Image::extractMask(void)
{
	Image *img = Image::create(this->width, this->height, 8);
	img->allocate();

	// use an 8bit palette to store all shades of grey
	for(int32 i = 0; i < 256; i++){
		img->palette[i*4+0] = i;
		img->palette[i*4+1] = i;
		img->palette[i*4+2] = i;
		img->palette[i*4+3] = 0xFF;
	}

	// Then use the alpha value as palette index
	uint8 *line = this->pixels;
	uint8 *nline = img->pixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 4:
			case 8:
				*np++ = this->palette[*p*4+3];
				p++;
				break;
			case 16:
				*np++ = 0xFF*!!(p[1]&0x80);
				p += 2;
				break;
			case 24:
				*np++ = 0xFF;
				p += 3;
				break;
			case 32:
				*np++ = p[3];
				p += 4;
				break;
			}
		}
		line += this->stride;
		nline += img->stride;
	}
	return img;
}